

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

uint8_t * js_load_file(JSContext *ctx,size_t *pbuf_len,char *filename)

{
  int iVar1;
  JSContext *ctx_00;
  JSContext *__n;
  int *piVar2;
  uint8_t *__ptr;
  JSContext *pJVar3;
  char *in_RDX;
  size_t *in_RSI;
  long in_RDI;
  long lret;
  size_t buf_len;
  uint8_t *buf;
  FILE *f;
  void *in_stack_ffffffffffffffb8;
  JSContext *ctx_01;
  size_t in_stack_ffffffffffffffd0;
  
  ctx_00 = (JSContext *)fopen(in_RDX,"rb");
  if (ctx_00 != (JSContext *)0x0) {
    iVar1 = fseek((FILE *)ctx_00,0,2);
    if ((-1 < iVar1) && (__n = (JSContext *)ftell((FILE *)ctx_00), -1 < (long)__n)) {
      if (__n == (JSContext *)0x7fffffffffffffff) {
        piVar2 = __errno_location();
        *piVar2 = 0x15;
      }
      else {
        ctx_01 = __n;
        iVar1 = fseek((FILE *)ctx_00,0,0);
        if (-1 < iVar1) {
          if (in_RDI == 0) {
            __ptr = (uint8_t *)malloc((size_t)((long)&(__n->header).ref_count + 1));
          }
          else {
            __ptr = (uint8_t *)js_malloc(ctx_00,in_stack_ffffffffffffffd0);
          }
          if (__ptr != (uint8_t *)0x0) {
            pJVar3 = (JSContext *)fread(__ptr,1,(size_t)__n,(FILE *)ctx_00);
            if (pJVar3 == __n) {
              __ptr[(long)__n] = '\0';
              fclose((FILE *)ctx_00);
              *in_RSI = (size_t)__n;
              return __ptr;
            }
            piVar2 = __errno_location();
            *piVar2 = 5;
            if (in_RDI == 0) {
              free(__ptr);
            }
            else {
              js_free(ctx_01,in_stack_ffffffffffffffb8);
            }
          }
        }
      }
    }
    fclose((FILE *)ctx_00);
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *js_load_file(JSContext *ctx, size_t *pbuf_len, const char *filename)
{
    FILE *f;
    uint8_t *buf;
    size_t buf_len;
    long lret;
    
    f = fopen(filename, "rb");
    if (!f)
        return NULL;
    if (fseek(f, 0, SEEK_END) < 0)
        goto fail;
    lret = ftell(f);
    if (lret < 0)
        goto fail;
    /* XXX: on Linux, ftell() return LONG_MAX for directories */
    if (lret == LONG_MAX) {
        errno = EISDIR;
        goto fail;
    }
    buf_len = lret;
    if (fseek(f, 0, SEEK_SET) < 0)
        goto fail;
    if (ctx)
        buf = js_malloc(ctx, buf_len + 1);
    else
        buf = malloc(buf_len + 1);
    if (!buf)
        goto fail;
    if (fread(buf, 1, buf_len, f) != buf_len) {
        errno = EIO;
        if (ctx)
            js_free(ctx, buf);
        else
            free(buf);
    fail:
        fclose(f);
        return NULL;
    }
    buf[buf_len] = '\0';
    fclose(f);
    *pbuf_len = buf_len;
    return buf;
}